

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxInWitnessUtxoDirect(Psbt *this,uint32_t index,TxOutReference *txout)

{
  void *pvVar1;
  uint64_t satoshi;
  CfdException *pCVar2;
  undefined4 in_register_00000034;
  int ret;
  wally_tx_output *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script script;
  int local_a4;
  undefined1 local_a0 [8];
  int local_98;
  char *local_90 [2];
  wally_tx_output *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  Script local_60;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x92a,"SetTxInWitnessUtxoDirect")
  ;
  pvVar1 = this->wally_psbt_pointer_;
  local_80 = (wally_tx_output *)0x0;
  Script::Script(&local_60,&(txout->super_AbstractTxOutReference).locking_script_);
  Script::GetData((ByteData *)local_a0,&local_60);
  ByteData::GetBytes(&local_78,(ByteData *)local_a0);
  if (local_a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a0,(long)local_90[0] - (long)local_a0);
  }
  local_a0 = (undefined1  [8])(txout->super_AbstractTxOutReference).value_.amount_;
  local_98 = CONCAT31(local_98._1_3_,(txout->super_AbstractTxOutReference).value_.ignore_check_);
  satoshi = Amount::GetSatoshiValue((Amount *)local_a0);
  local_a4 = wally_tx_output_init_alloc
                       (satoshi,local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&local_80);
  if (local_a4 == 0) {
    local_a4 = wally_psbt_input_set_witness_utxo
                         ((wally_psbt_input *)
                          ((ulong)index * 0x110 + *(long *)((long)pvVar1 + 0x10)),local_80);
    wally_tx_output_free(local_80);
    if (local_a4 == 0) {
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Script::~Script(&local_60);
      return;
    }
    local_a0 = (undefined1  [8])0x6e567f;
    local_98 = 0x93d;
    local_90[0] = "SetTxInWitnessUtxoDirect";
    logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                      "wally_psbt_input_set_witness_utxo NG[{}]",&local_a4);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0 = (undefined1  [8])local_90;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"psbt add witness utxo error.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_a0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a0 = (undefined1  [8])0x6e567f;
  local_98 = 0x935;
  local_90[0] = "SetTxInWitnessUtxoDirect";
  logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                    "wally_tx_output_init_alloc NG[{}]",&local_a4);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0 = (undefined1  [8])local_90;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"psbt alloc output error.","");
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_a0);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInWitnessUtxoDirect(
    uint32_t index, const TxOutReference &txout) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *output = nullptr;
  auto script = txout.GetLockingScript();
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }
}